

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O2

err_t bign96KeypairVal(bign_params *params,octet *privkey,octet *pubkey)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec;
  u64 *dest;
  u64 *dest_00;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    eVar2 = 0x1f6;
    if (params->l == 0x60) {
      sVar4 = bign96Start_keep(bign96KeypairVal_deep);
      ec = (ec_o *)blobCreate(sVar4);
      if (ec == (ec_o *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        eVar2 = bign96Start(ec,params);
        if (eVar2 == 0) {
          sVar4 = ec->f->n;
          bVar1 = memIsValid(privkey,0x18);
          eVar2 = 0x6d;
          if ((bVar1 != 0) && (bVar1 = memIsValid(pubkey,0x30), bVar1 != 0)) {
            dest_00 = (u64 *)((long)&(ec->hdr).keep + (ec->hdr).keep);
            dest = dest_00 + sVar4;
            u64From(dest_00,privkey,0x18);
            u64From(dest,params->q,0x18);
            bVar1 = wwIsZero(dest_00,sVar4);
            eVar2 = 0x1f8;
            if ((bVar1 == 0) && (iVar3 = wwCmp(dest_00,dest,sVar4), iVar3 < 0)) {
              bVar1 = ecMulA(dest,ec->base,ec,dest_00,sVar4,dest + sVar4 * 2);
              if (bVar1 == 0) {
                eVar2 = 0x1f6;
              }
              else {
                u64To(dest,0x30,dest);
                bVar1 = memEq(dest,pubkey,0x30);
                eVar2 = 0x1f9;
                if (bVar1 != 0) {
                  eVar2 = 0;
                }
              }
            }
          }
        }
        blobClose(ec);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bign96KeypairVal(const bign_params* params, const octet privkey[24],
	const octet pubkey[48])
{
	err_t code;
	size_t n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96KeypairVal_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(privkey, 24) || !memIsValid(pubkey, 48))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// d <- privkey
	wwFrom(d, privkey, 24);
	// 0 < d < q?
	wwFrom(Q, params->q, 24);
	if (wwIsZero(d, n) || wwCmp(d, Q, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// Q <- d G
	if (ecMulA(Q, ec->base, ec, d, n, stack))
	{
		// Q == pubkey?
		wwTo(Q, 48, Q);
		if (!memEq(Q, pubkey, 48))
			code = ERR_BAD_PUBKEY;
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}